

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureMipmapTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles2::Functional::Texture2DGenMipmapCase::iterate(Texture2DGenMipmapCase *this)

{
  int i;
  int iVar1;
  deUint32 dVar2;
  int iVar3;
  qpTestResult testResult;
  undefined4 extraout_var;
  ulong uVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TextureFormat TVar5;
  long lVar6;
  undefined4 extraout_var_02;
  byte bVar7;
  GenMipmapPrecision *pGVar8;
  GenMipmapPrecision *pGVar9;
  char *description;
  ulong uVar10;
  int preferredWidth;
  uint uVar11;
  int preferredHeight;
  GenMipmapPrecision *format;
  uint uVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  BVec4 formatMask;
  RandomViewport viewport;
  vector<float,_std::allocator<float>_> texCoord;
  IVec4 framebufferBits;
  IVec4 cmpBits;
  IVec4 formatBits;
  Texture2D resultTexture;
  uint local_12c;
  GenMipmapPrecision local_128;
  vector<float,_std::allocator<float>_> local_108;
  GenMipmapPrecision local_e8;
  TextureRenderer *local_c8;
  long local_c0;
  IVec4 local_b8;
  tcu local_a8 [24];
  tcu local_90 [8];
  float afStack_88 [2];
  Texture2D local_80;
  
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  local_c0 = CONCAT44(extraout_var,iVar1);
  uVar13 = this->m_height;
  if (this->m_height < this->m_width) {
    uVar13 = this->m_width;
  }
  if (uVar13 == 0) {
    uVar11 = 0x20;
  }
  else {
    uVar11 = 0x1f;
    if (uVar13 != 0) {
      for (; uVar13 >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
    uVar11 = uVar11 ^ 0x1f;
  }
  local_128.filterBits.m_data[0] = 8;
  local_128.filterBits.m_data[1] = 3;
  tcu::Texture2D::Texture2D
            (&local_80,(TextureFormat *)&local_128,(this->m_texture->m_refTexture).m_width,
             (this->m_texture->m_refTexture).m_height);
  local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tcu::Texture2D::allocLevel(&this->m_texture->m_refTexture,0);
  local_128.filterBits.m_data[0] = 0x3f800000;
  local_128.filterBits.m_data[1] = 0x3f000000;
  local_128.filterBits.m_data[2] = 0;
  local_128.colorThreshold.m_data[0] = 0.5;
  local_e8.filterBits.m_data[0] = 0;
  local_e8.filterBits.m_data[1] = 0;
  local_e8.filterBits.m_data[2] = 0x3f800000;
  local_e8.colorThreshold.m_data[0] = 1.0;
  tcu::fillWithGrid((this->m_texture->m_refTexture).super_TextureLevelPyramid.m_access.
                    super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,8,(Vec4 *)&local_128,(Vec4 *)&local_e8
                   );
  (*this->m_texture->_vptr_Texture2D[2])();
  (**(code **)(local_c0 + 0xb8))(0xde1,this->m_texture->m_glTexture);
  (**(code **)(local_c0 + 0x1360))(0xde1,0x2802,0x812f);
  (**(code **)(local_c0 + 0x1360))(0xde1,0x2803,0x812f);
  (**(code **)(local_c0 + 0x1360))(0xde1,0x2801,0x2700);
  (**(code **)(local_c0 + 0x1360))(0xde1,0x2800,0x2600);
  dVar2 = (**(code **)(local_c0 + 0x800))();
  glu::checkError(dVar2,"After texture setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureMipmapTests.cpp"
                  ,0x345);
  (**(code **)(local_c0 + 0xc18))(0x8192,this->m_hint);
  (**(code **)(local_c0 + 0x710))(0xde1);
  dVar2 = (**(code **)(local_c0 + 0x800))();
  glu::checkError(dVar2,"glGenerateMipmap()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureMipmapTests.cpp"
                  ,0x34a);
  local_128.filterBits.m_data[0] = 0;
  local_128.filterBits.m_data[1] = 0;
  local_e8.filterBits.m_data[0] = 0x3f800000;
  local_e8.filterBits.m_data[1] = 0x3f800000;
  glu::TextureTestUtil::computeQuadTexCoord2D(&local_108,(Vec2 *)&local_128,(Vec2 *)&local_e8);
  if (uVar13 != 0) {
    local_c8 = &this->m_renderer;
    uVar10 = 0;
    uVar4 = (ulong)(0x1f - uVar11);
    if ((int)(0x1f - uVar11) < 1) {
      uVar4 = uVar10;
    }
    local_e8._24_8_ = uVar4 * 0x28 + 0x28;
    iVar1 = 0;
    do {
      preferredWidth = this->m_width >> ((byte)iVar1 & 0x1f);
      if (preferredWidth < 2) {
        preferredWidth = 1;
      }
      preferredHeight = this->m_height >> ((byte)iVar1 & 0x1f);
      if (preferredHeight < 2) {
        preferredHeight = 1;
      }
      iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
      dVar2 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
      deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
                ((RandomViewport *)&local_128,(RenderTarget *)CONCAT44(extraout_var_00,iVar3),
                 preferredWidth,preferredHeight,dVar2 + iVar1);
      (**(code **)(local_c0 + 0x1a00))
                (local_128.filterBits.m_data[0],local_128.filterBits.m_data[1],
                 local_128.filterBits.m_data[2]);
      deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
                (local_c8,0,
                 local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,TEXTURETYPE_2D);
      tcu::Texture2D::allocLevel(&local_80,iVar1);
      glu::readPixels(this->m_renderCtx,local_128.filterBits.m_data[0],
                      local_128.filterBits.m_data[1],
                      (PixelBufferAccess *)
                      ((long)((local_80.super_TextureLevelPyramid.m_access.
                               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_ConstPixelBufferAccess).m_size.m_data + (uVar10 - 8)));
      iVar1 = iVar1 + 1;
      uVar10 = uVar10 + 0x28;
    } while (local_e8._24_8_ != uVar10);
  }
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  lVar6 = CONCAT44(extraout_var_01,iVar1);
  local_e8.filterBits.m_data[0] = *(int *)(lVar6 + 8) - 2;
  local_e8.filterBits.m_data[1] = *(int *)(lVar6 + 0xc) - 2;
  local_e8.filterBits.m_data[2] = *(int *)(lVar6 + 0x10) - 2;
  uVar13 = *(int *)(lVar6 + 0x14) - 2;
  local_e8.filterBits.m_data[0] =
       -(uint)(0 < local_e8.filterBits.m_data[0]) & local_e8.filterBits.m_data[0];
  local_e8.filterBits.m_data[1] =
       -(uint)(0 < local_e8.filterBits.m_data[1]) & local_e8.filterBits.m_data[1];
  local_e8.filterBits.m_data[2] =
       -(uint)(0 < local_e8.filterBits.m_data[2]) & local_e8.filterBits.m_data[2];
  local_e8.colorThreshold.m_data[0] = (float)(-(uint)(0 < (int)uVar13) & uVar13);
  TVar5 = glu::mapGLTransferFormat(this->m_format,this->m_dataType);
  format = &local_128;
  local_128.filterBits.m_data[0] = TVar5.order;
  local_128.filterBits.m_data[1] = TVar5.type;
  tcu::getTextureFormatBitDepth(local_a8,(TextureFormat *)format);
  auVar16._4_4_ = local_e8.filterBits.m_data[1];
  auVar16._0_4_ = local_e8.filterBits.m_data[0];
  auVar16._8_4_ = local_e8.filterBits.m_data[2];
  auVar16._12_4_ = local_e8.colorThreshold.m_data[0];
  auVar15._0_4_ = -(uint)(local_e8.filterBits.m_data[0] < local_a8._0_4_);
  auVar15._4_4_ = -(uint)(local_e8.filterBits.m_data[1] < local_a8._4_4_);
  auVar15._8_4_ = -(uint)(local_e8.filterBits.m_data[2] < local_a8._8_4_);
  auVar15._12_4_ = -(uint)((int)local_e8.colorThreshold.m_data[0] < local_a8._12_4_);
  auVar14._0_4_ = -(uint)(0 < local_a8._0_4_);
  auVar14._4_4_ = -(uint)(0 < local_a8._4_4_);
  auVar14._8_4_ = -(uint)(0 < local_a8._8_4_);
  auVar14._12_4_ = -(uint)(0 < local_a8._12_4_);
  auVar14 = packssdw(auVar14,auVar14);
  auVar14 = packsswb(auVar14,auVar14);
  local_12c = auVar14._0_4_ & (uint)DAT_01b805f0;
  auVar16 = ~auVar15 & local_a8._0_16_ | auVar16 & auVar15;
  local_128.filterBits.m_data[0] = auVar16._0_4_;
  local_128.filterBits.m_data[1] = auVar16._4_4_;
  local_128.filterBits.m_data[2] = auVar16._8_4_;
  local_128.colorThreshold.m_data[0] = auVar16._12_4_;
  local_b8.m_data[0] = 0;
  local_b8.m_data[1] = 0;
  local_b8.m_data[2] = 0;
  local_b8.m_data[3] = 0;
  lVar6 = 0;
  pGVar9 = &local_e8;
  do {
    pGVar8 = pGVar9;
    if (*(char *)((long)&local_12c + lVar6) != '\0') {
      pGVar8 = format;
    }
    local_b8.m_data[lVar6] = (pGVar8->filterBits).m_data[0];
    lVar6 = lVar6 + 1;
    pGVar9 = (GenMipmapPrecision *)((pGVar9->filterBits).m_data + 1);
    format = (GenMipmapPrecision *)((format->filterBits).m_data + 1);
  } while (lVar6 != 4);
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  lVar6 = CONCAT44(extraout_var_02,iVar1);
  auVar12._0_4_ = -(uint)(0 < *(int *)(lVar6 + 8));
  auVar12._4_4_ = -(uint)(0 < *(int *)(lVar6 + 0xc));
  auVar12._8_4_ = -(uint)(0 < *(int *)(lVar6 + 0x10));
  auVar12._12_4_ = -(uint)(0 < *(int *)(lVar6 + 0x14));
  uVar13 = movmskps(iVar1,auVar12);
  bVar7 = (byte)uVar13;
  local_128.colorMask.m_data =
       (bool  [4])
       (uVar13 & 1 | (uint)((bVar7 & 2) >> 1) << 8 | (uint)((bVar7 & 4) >> 2) << 0x10 |
       (uint)(bVar7 >> 3) << 0x18);
  tcu::computeFixedPointThreshold(local_90,&local_b8);
  local_128.colorThreshold.m_data[0] = local_90._0_4_;
  local_128.colorThreshold.m_data[1] = local_90._4_4_;
  local_128.colorThreshold.m_data[2] = afStack_88[0];
  local_128.colorThreshold.m_data[3] = afStack_88[1];
  local_128.filterBits.m_data[0] = 4;
  local_128.filterBits.m_data[1] = 4;
  local_128.filterBits.m_data[2] = 0;
  testResult = glu::TextureTestUtil::compareGenMipmapResult
                         (((this->super_TestCase).super_TestNode.m_testCtx)->m_log,&local_80,
                          &this->m_texture->m_refTexture,&local_128);
  if (testResult == QP_TEST_RESULT_PASS) {
    description = "Pass";
  }
  else if (testResult == QP_TEST_RESULT_QUALITY_WARNING) {
    description = "Low-quality method used";
  }
  else {
    description = glcts::fixed_sample_locations_values + 1;
    if (testResult == QP_TEST_RESULT_FAIL) {
      description = "Image comparison failed";
    }
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,testResult,description);
  if (local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  tcu::Texture3D::~Texture3D((Texture3D *)&local_80);
  return STOP;
}

Assistant:

Texture2DGenMipmapCase::IterateResult Texture2DGenMipmapCase::iterate (void)
{
	const glw::Functions&	gl					= m_renderCtx.getFunctions();

	const deUint32			minFilter			= GL_NEAREST_MIPMAP_NEAREST;
	const deUint32			magFilter			= GL_NEAREST;
	const deUint32			wrapS				= GL_CLAMP_TO_EDGE;
	const deUint32			wrapT				= GL_CLAMP_TO_EDGE;

	const int				numLevels			= deLog2Floor32(de::max(m_width, m_height))+1;

	tcu::Texture2D			resultTexture		(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), m_texture->getRefTexture().getWidth(), m_texture->getRefTexture().getHeight());

	vector<float>			texCoord;

	// Initialize texture level 0 with colored grid.
	m_texture->getRefTexture().allocLevel(0);
	tcu::fillWithGrid(m_texture->getRefTexture().getLevel(0), 8, tcu::Vec4(1.0f, 0.5f, 0.0f, 0.5f), tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f));

	// Upload data and setup params.
	m_texture->upload();

	gl.bindTexture	(GL_TEXTURE_2D, m_texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		wrapS);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		wrapT);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	minFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	magFilter);
	GLU_EXPECT_NO_ERROR(gl.getError(), "After texture setup");

	// Generate mipmap.
	gl.hint(GL_GENERATE_MIPMAP_HINT, m_hint);
	gl.generateMipmap(GL_TEXTURE_2D);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenerateMipmap()");

	// Use (0, 0) -> (1, 1) texture coordinates.
	computeQuadTexCoord2D(texCoord, Vec2(0.0f, 0.0f), Vec2(1.0f, 1.0f));

	// Fetch resulting texture by rendering.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		const int				levelWidth		= de::max(1, m_width >> levelNdx);
		const int				levelHeight		= de::max(1, m_height >> levelNdx);
		const RandomViewport	viewport		(m_renderCtx.getRenderTarget(), levelWidth, levelHeight, deStringHash(getName()) + levelNdx);

		gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);
		m_renderer.renderQuad(0, &texCoord[0], TEXTURETYPE_2D);

		resultTexture.allocLevel(levelNdx);
		glu::readPixels(m_renderCtx, viewport.x, viewport.y, resultTexture.getLevel(levelNdx));
	}

	// Compare results
	{

		const IVec4			framebufferBits		= max(getBitsVec(m_renderCtx.getRenderTarget().getPixelFormat())-2, IVec4(0));
		const IVec4			formatBits			= tcu::getTextureFormatBitDepth(glu::mapGLTransferFormat(m_format, m_dataType));
		const tcu::BVec4	formatMask			= greaterThan(formatBits, IVec4(0));
		const IVec4			cmpBits				= select(min(framebufferBits, formatBits), framebufferBits, formatMask);
		GenMipmapPrecision	comparePrec;

		comparePrec.colorMask		= getCompareMask(m_renderCtx.getRenderTarget().getPixelFormat());
		comparePrec.colorThreshold	= tcu::computeFixedPointThreshold(cmpBits);
		comparePrec.filterBits		= tcu::IVec3(4, 4, 0);

		const qpTestResult compareResult = compareGenMipmapResult(m_testCtx.getLog(), resultTexture, m_texture->getRefTexture(), comparePrec);

		m_testCtx.setTestResult(compareResult, compareResult == QP_TEST_RESULT_PASS				? "Pass" :
											   compareResult == QP_TEST_RESULT_QUALITY_WARNING	? "Low-quality method used"	:
											   compareResult == QP_TEST_RESULT_FAIL				? "Image comparison failed"	: "");
	}

	return STOP;
}